

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall ThirdTag::ThirdTag(ThirdTag *this,tag_t<cfgfile::string_trait_t> *owner)

{
  allocator<char> local_39;
  string_t local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"thirdTag",&local_39);
  cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
            (&this->super_tag_t<cfgfile::string_trait_t>,owner,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t = (_func_int **)&PTR__tag_t_001575e8;
  this->m_started = false;
  this->m_finished = false;
  this->m_withString = false;
  return;
}

Assistant:

explicit ThirdTag( tag_t<> & owner )
		:	cfgfile::tag_t<>( owner, "thirdTag", false )
		,	m_started( false )
		,	m_finished( false )
		,	m_withString( false )
	{
	}